

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Iterator.h
# Opt level: O1

void __thiscall arangodb::velocypack::ObjectIterator::next(ObjectIterator *this)

{
  uint8_t *puVar1;
  ulong uVar2;
  byte *local_18;
  
  if (this->_position != this->_size) {
    this->_position = this->_position + 1;
    local_18 = this->_current;
    if (local_18 != (byte *)0x0) {
      uVar2 = (ulong)"\x01\x01"[*local_18];
      if (uVar2 == 0) {
        uVar2 = SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice>::byteSizeDynamic
                          ((SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice> *)
                           &local_18,local_18);
      }
      puVar1 = this->_current;
      local_18 = puVar1 + uVar2;
      this->_current = local_18;
      uVar2 = (ulong)"\x01\x01"[puVar1[uVar2]];
      if (uVar2 == 0) {
        uVar2 = SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice>::byteSizeDynamic
                          ((SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice> *)
                           &local_18,local_18);
      }
      this->_current = this->_current + uVar2;
    }
  }
  return;
}

Assistant:

[[nodiscard]] Slice key(bool translate = true) const {
    if (VELOCYPACK_UNLIKELY(!valid())) {
      throw Exception{Exception::IndexOutOfBounds};
    }
    if (_current != nullptr) {
      Slice s{_current};
      return translate ? s.makeKey() : s;
    }
    return _slice.getNthKey(_position, translate);
  }